

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  DString *pDVar2;
  int local_6c;
  int i;
  DString *buffer;
  arg_lit *paStack_58;
  int nerrors;
  void *argtable [5];
  int local_28;
  short sStack_22;
  _Bool array_out;
  int exitcode;
  short format;
  char *binname;
  char **argv_local;
  int argc_local;
  
  sStack_22 = 0;
  local_28 = 0;
  argtable[4]._7_1_ = 0;
  a_help = arg_lit0((char *)0x0,"help","display this help and exit");
  paStack_58 = a_help;
  a_array = arg_lit0("a","array","output as array of arrays");
  argtable[0] = a_array;
  a_format = arg_str0("f","from","FORMAT",
                      "convert from tabular data format (default CSV), FORMAT = csv|tsv");
  argtable[1] = a_format;
  a_file = arg_filen((char *)0x0,(char *)0x0,"<FILE>",0,argc + 2,
                     "read input from file(s) -- use stdin if no files given");
  argtable[2] = a_file;
  a_end = arg_end(0x14);
  argtable[3] = a_end;
  iVar1 = arg_parse(argc,argv,&stack0xffffffffffffffa8);
  if (a_help->count < 1) {
    if (iVar1 < 1) {
      if (0 < a_array->count) {
        argtable[4]._7_1_ = 1;
      }
      if (0 < a_format->count) {
        iVar1 = strcmp(*a_format->sval,"csv");
        if (iVar1 == 0) {
          sStack_22 = 0;
        }
        else {
          iVar1 = strcmp(*a_format->sval,"tsv");
          if (iVar1 != 0) {
            fprintf(_stderr,"%s: Unknown input format \'%s\'\n","tdp",*a_format->sval);
            local_28 = 1;
            goto LAB_001037b9;
          }
          sStack_22 = 1;
        }
      }
      if (a_file->count == 0) {
        pDVar2 = stdin_buffer();
        convert_buffer(pDVar2,sStack_22,(_Bool)(argtable[4]._7_1_ & 1));
        d_string_free(pDVar2,true);
      }
      else {
        for (local_6c = 0; local_6c < a_file->count; local_6c = local_6c + 1) {
          pDVar2 = scan_file(a_file->filename[local_6c]);
          if (pDVar2 == (DString *)0x0) {
            fprintf(_stderr,"Error reading file \'%s\'\n",a_file->filename[local_6c]);
            local_28 = 1;
            break;
          }
          convert_buffer(pDVar2,sStack_22,(_Bool)(argtable[4]._7_1_ & 1));
          d_string_free(pDVar2,true);
        }
      }
    }
    else {
      arg_print_errors(_stdout,a_end,"tdp");
      local_28 = 1;
    }
  }
  else {
    printf("\n\tUsage: %s","tdp");
    arg_print_syntax(_stdout,&stack0xffffffffffffffa8,"\n\n");
    printf("Options:\n");
    arg_print_glossary(_stdout,&stack0xffffffffffffffa8,"\t%-25s %s\n");
    printf("\n");
    local_28 = 1;
  }
LAB_001037b9:
  arg_freetable(&stack0xffffffffffffffa8,5);
  return local_28;
}

Assistant:

int main( int argc, char ** argv ) {
	char * binname = "tdp";
	short format = FORMAT_CSV;
	int exitcode = EXIT_SUCCESS;
	bool array_out = false;

	void * argtable[] = {
		a_help			= arg_lit0(NULL, "help", "display this help and exit"),

		a_array			= arg_lit0("a", "array", "output as array of arrays"),

		a_format		= arg_str0("f", "from", "FORMAT", "convert from tabular data format (default CSV), FORMAT = csv|tsv"),

		a_file 			= arg_filen(NULL, NULL, "<FILE>", 0, argc + 2, "read input from file(s) -- use stdin if no files given"),

		a_end 			= arg_end(20),
	};

	int nerrors = arg_parse(argc, argv, argtable);

	if (a_help->count > 0) {
		printf("\n\tUsage: %s", binname);
		arg_print_syntax(stdout, argtable, "\n\n");
		printf("Options:\n");
		arg_print_glossary(stdout, argtable, "\t%-25s %s\n");
		printf("\n");
		exitcode = 1;
		goto exit;
	}

	if (nerrors > 0) {
		arg_print_errors(stdout, a_end, binname);
		exitcode = 1;
		goto exit;
	}

	if (a_array->count > 0) {
		array_out = true;
	}

	if (a_format->count > 0) {
		if (strcmp(a_format->sval[0], "csv") == 0) {
			format = FORMAT_CSV;
		} else if (strcmp(a_format->sval[0], "tsv") == 0) {
			format = FORMAT_TSV;
		} else {
			fprintf(stderr, "%s: Unknown input format '%s'\n", binname, a_format->sval[0]);
			exitcode = 1;
			goto exit;
		}
	}

	DString * buffer;

	if (a_file->count == 0) {
		// Read from stdin
		buffer = stdin_buffer();
		convert_buffer(buffer, format, array_out);
		d_string_free(buffer, true);
	} else {
		// Read from files
		for (int i = 0; i < a_file->count; ++i) {
			buffer = scan_file(a_file->filename[i]);

			if (buffer == NULL) {
				fprintf(stderr, "Error reading file '%s'\n", a_file->filename[i]);
				exitcode = 1;
				goto exit;
			}

			convert_buffer(buffer, format, array_out);
			d_string_free(buffer, true);
		}
	}

exit:
	arg_freetable(argtable, sizeof(argtable) / sizeof(argtable[0]));

	return exitcode;
}